

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::
make_next_inequality_node(branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this)

{
  pointer *ppnVar1;
  uint uVar2;
  int iVar3;
  pointer pnVar4;
  pointer pcVar5;
  size_type sVar6;
  reference pvVar7;
  value_type *pvVar8;
  uint uVar9;
  ptrdiff_t _Num;
  ulong __n;
  pointer piVar10;
  uint level;
  uint local_30;
  int local_2c;
  longdouble local_28;
  
  pnVar4 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = pnVar4[-1].level;
  local_30 = uVar9 + 1;
  uVar2 = (this->subvector).m_element_size;
  if (local_30 < uVar2) {
    pnVar4[-1].level = local_30;
    uVar9 = uVar9 + 2;
    local_28 = pnVar4[-1].sumr;
    pnVar4[-1].z = local_28;
    if (uVar9 < uVar2) {
      piVar10 = (this->items).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar4[-1].z = piVar10[uVar9].sum_z + local_28;
    }
    else {
      piVar10 = (this->items).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    uVar9 = pnVar4[-1].variables;
    local_28 = piVar10[local_30].r + local_28;
    local_2c = pnVar4[-1].sumfactor + piVar10[local_30].factor;
    pvVar7 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
             ::emplace_back<long_double,int,unsigned_int_const&>
                       ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
                         *)&this->nodes,&local_28,&local_2c,&local_30);
    sVar6 = shared_subvector::emplace(&this->subvector);
    pvVar7->variables = sVar6;
    __n = (ulong)(this->subvector).m_element_size;
    if (__n != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + sVar6,pcVar5 + uVar9,__n);
      sVar6 = pvVar7->variables;
    }
    pvVar8 = shared_subvector::operator[](&this->subvector,sVar6 + local_30);
    *pvVar8 = '\x01';
    uVar2 = (this->subvector).m_element_size;
    if (local_30 + 1 < uVar2) {
      pvVar7->z = (this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_30 + 1].sum_z + pvVar7->sumr;
    }
    iVar3 = pvVar7->sumfactor;
    if (iVar3 <= this->b_max && this->b_min <= iVar3) {
      if (pvVar7->sumr <= this->lower_bound) {
        return;
      }
      if ((ulong)uVar2 != 0) {
        pcVar5 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar5 + this->solution,pcVar5 + uVar9,(ulong)uVar2);
      }
      local_30 = local_30 + this->solution;
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5[local_30] = pcVar5[local_30] == '\0';
      this->lower_bound =
           (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].sumr;
      return;
    }
    if (iVar3 <= this->b_max) {
      return;
    }
    uVar9 = pvVar7->variables;
  }
  else {
    uVar9 = pnVar4[-1].variables;
  }
  shared_subvector::remove(&this->subvector,(char *)(ulong)uVar9);
  ppnVar1 = &(this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppnVar1 = *ppnVar1 + -1;
  return;
}

Assistant:

void make_next_inequality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (b_min <= node_1.sumfactor && node_1.sumfactor <= b_max) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
        } else if (node_1.sumfactor > b_max) {
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }